

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O1

void Col_MListRemove(Col_Word mlist,size_t first,size_t last)

{
  Col_Word *pCVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  Col_Word CVar5;
  Col_Word right;
  ulong uVar6;
  size_t first_00;
  byte *pbVar7;
  Col_Word root;
  Col_Word tail;
  byte *local_48;
  Col_Word *local_40;
  byte *local_38;
  
  if (last < first) {
    return;
  }
  local_40 = (Col_Word *)(mlist + 0x10);
  pbVar7 = *(byte **)(mlist + 0x10);
  local_48 = pbVar7;
  sVar3 = Col_ListLength(mlist);
  sVar4 = Col_ListLoopLength(mlist);
  pCVar1 = local_40;
  uVar6 = sVar3 - sVar4;
  if (uVar6 != 0 || sVar4 == 0) {
    if (sVar4 == 0) {
      if (sVar3 <= first) {
        return;
      }
      sVar4 = sVar3 - 1;
      if (last < sVar3) {
        sVar4 = last;
      }
      MListRemove(local_40,first,sVar4);
      return;
    }
    if (pbVar7 == (byte *)0x0) {
      uVar2 = 0;
    }
    else if (((ulong)pbVar7 & 0xf) == 0) {
      uVar2 = -(uint)((*pbVar7 & 2) == 0) | *pbVar7 & 0xfffffffe;
    }
    else {
      uVar2 = immediateWordTypes[(uint)pbVar7 & 0x1f];
    }
    if (uVar2 != 0x26) {
      ConvertToMConcatNode((Col_Word *)&local_48);
      *pCVar1 = (Col_Word)local_48;
    }
    if ((first == 0) && (uVar6 - 1 <= last)) {
      *pCVar1 = *(Col_Word *)(local_48 + 0x18);
      if (last < uVar6) {
        return;
      }
      Col_MListRemove(mlist,0,last - uVar6);
      return;
    }
    if (last < uVar6) {
      MListRemove((Col_Word *)(local_48 + 0x10),first,last);
    }
    else {
      sVar3 = first - uVar6;
      if (first < uVar6) {
        MListRemove((Col_Word *)(local_48 + 0x10),first,uVar6 - 1);
        sVar3 = 0;
      }
      pbVar7 = local_48;
      *(undefined8 *)(mlist + 0x10) = *(undefined8 *)(local_48 + 0x18);
      Col_MListRemove(mlist,sVar3,last - uVar6);
      local_38 = *(byte **)(mlist + 0x10);
      if ((((ulong)local_38 & 0xf) == 0) || ((0x11000100U >> ((uint)local_38 & 0x1f) & 1) == 0)) {
        if (local_38 == (byte *)0x0) {
          uVar2 = 0;
        }
        else if (((ulong)local_38 & 0xf) == 0) {
          uVar2 = -(uint)((*local_38 & 2) == 0) | *local_38 & 0xfffffffe;
        }
        else {
          uVar2 = immediateWordTypes[(uint)local_38 & 0x1f];
        }
        if (uVar2 != 0x26) {
          ConvertToMConcatNode((Col_Word *)&local_38);
        }
        *(undefined8 *)(pbVar7 + 0x18) = *(undefined8 *)(local_38 + 0x18);
        *(undefined8 *)(local_38 + 0x18) = *(undefined8 *)(local_38 + 0x10);
        *(undefined8 *)(local_38 + 0x10) = *(undefined8 *)(pbVar7 + 0x10);
        *(byte **)(pbVar7 + 0x10) = local_38;
        UpdateMConcatNode((Col_Word)local_38);
      }
      else {
        *(byte **)(pbVar7 + 0x18) = local_38;
      }
      *pCVar1 = (Col_Word)pbVar7;
    }
    UpdateMConcatNode((Col_Word)local_48);
    return;
  }
  if (first == 0) {
    pbVar7 = (byte *)((ulong)pbVar7 & 0xfffffffffffffff7);
    local_48 = pbVar7;
    CVar5 = Col_Sublist((Col_Word)pbVar7,last % sVar4 + 1,sVar3 - 1);
    right = Col_Sublist((Col_Word)pbVar7,0,last % sVar4);
    local_48 = (byte *)NewMConcatList(CVar5,right);
  }
  else {
    first_00 = sVar4;
    if (first % sVar4 != 0) {
      first_00 = first % sVar4;
    }
    uVar6 = last % sVar4;
    if (uVar6 < first_00) {
      CVar5 = Col_Sublist(mlist,0,uVar6);
      local_48 = (byte *)((ulong)pbVar7 & 0xfffffffffffffff7);
      if (first_00 < sVar3) {
        MListRemove((Col_Word *)&local_48,first_00,sVar3 - 1);
      }
      MListRemove((Col_Word *)&local_48,0,uVar6);
      CVar5 = NewMConcatList(CVar5,(ulong)local_48 | 8);
      goto LAB_00110ae2;
    }
    local_48 = (byte *)((ulong)pbVar7 & 0xfffffffffffffff7);
    MListRemove((Col_Word *)&local_48,first_00,uVar6);
  }
  CVar5 = (ulong)local_48 | 8;
LAB_00110ae2:
  *local_40 = CVar5;
  return;
}

Assistant:

void
Col_MListRemove(
    Col_Word mlist, /*!< Mutable list to remove sequence from. */
    size_t first,   /*!< Index of first element in range to remove. */
    size_t last)    /*!< Index of last element in range to remove. */
{
    size_t length, loop;
    Col_Word root;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_MLIST,mlist} */
    TYPECHECK_MLIST(mlist) return;

    if (first > last) {
        /*
         * No-op.
         */

        return;
    }

    ASSERT(WORD_TYPE(mlist) == WORD_TYPE_WRAP);
    root = WORD_WRAP_SOURCE(mlist);

    length = Col_ListLength(mlist);
    loop = Col_ListLoopLength(mlist);
    if (loop && length == loop) {
        /*
         * List is circular.
         */

        ASSERT(WORD_TYPE(root) == WORD_TYPE_CIRCLIST);

        if (first == 0) {
            /*
             * Rotate loop.
             */

            last %= loop;
            root = WORD_CIRCLIST_CORE(root);
            root = NewMConcatList(
                Col_Sublist(root, last+1, length-1),
                Col_Sublist(root, 0, last));
            WORD_WRAP_SOURCE(mlist) = WORD_CIRCLIST_NEW(root);
        } else {
            /*
             * Remove middle of loop.
             */

            first %= loop;
            if (first == 0) first = loop;
            last %= loop;

            if (last < first) {
                /*
                 * Keep inner part of loop and use beginning as head.
                 */

                Col_Word head, node;

                head = Col_Sublist(mlist, 0, last);
                root = WORD_CIRCLIST_CORE(root);
                if (first < length) {
                    MListRemove(&root, first, length-1);
                }
                MListRemove(&root, 0, last);

                node = NewMConcatList(head, WORD_CIRCLIST_NEW(root));
                WORD_WRAP_SOURCE(mlist) = node;
            } else {
                /*
                 * Remove inner part of loop.
                 */

                root = WORD_CIRCLIST_CORE(root);
                MListRemove(&root, first, last);
                WORD_WRAP_SOURCE(mlist) = WORD_CIRCLIST_NEW(root);
            }
        }
        return;
    } else if (loop) {
        /*
         * List is cyclic.
         */

        if (WORD_TYPE(root) != WORD_TYPE_MCONCATLIST) {
            ConvertToMConcatNode(&root);
            WORD_WRAP_SOURCE(mlist) = root;
        }
        ASSERT(WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
        ASSERT(WORD_TYPE(WORD_CONCATLIST_RIGHT(root)) == WORD_TYPE_CIRCLIST);

        if (first == 0 && last >= length-loop-1) {
            /*
             * Remove whole head and recurse on tail.
             */

            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_RIGHT(root);
            if (last >= length-loop) {
                Col_MListRemove(mlist, 0, last - (length-loop));
            }
            return;
        }

        if (last < length-loop) {
            /*
             * Remove within head.
             */

            MListRemove(&WORD_CONCATLIST_LEFT(root), first, last);
        } else {
            /*
             * Remove part of tail.
             */

            Col_Word tail;

            if (first >= length-loop) {
                first -= length-loop;
                last -= length-loop;
            } else {
                /*
                 * Remove end of head first.
                 */

                MListRemove(&WORD_CONCATLIST_LEFT(root), first, length-loop-1);
                first = 0;
                last -= length-loop;
            }

            /*
             *  Temporarily use tail as root before recursive call.
             */

            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_RIGHT(root);
            Col_MListRemove(mlist, first, last);
            tail = WORD_WRAP_SOURCE(mlist);
            if (WORD_TYPE(tail) != WORD_TYPE_CIRCLIST) {
                /*
                 * Circular list was made cyclic in the process. Move head to
                 * left.
                 */

                if (WORD_TYPE(tail) != WORD_TYPE_MCONCATLIST) {
                    ConvertToMConcatNode(&tail);
                }
                ASSERT(WORD_TYPE(tail) == WORD_TYPE_MCONCATLIST);
                WORD_CONCATLIST_RIGHT(root) = WORD_CONCATLIST_RIGHT(tail);
                WORD_CONCATLIST_RIGHT(tail) = WORD_CONCATLIST_LEFT(tail);
                WORD_CONCATLIST_LEFT(tail) = WORD_CONCATLIST_LEFT(root);
                WORD_CONCATLIST_LEFT(root) = tail;
                UpdateMConcatNode(tail);
            } else {
                WORD_CONCATLIST_RIGHT(root) = tail;
            }

            ASSERT(WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
            ASSERT(WORD_TYPE(WORD_CONCATLIST_RIGHT(root)) == WORD_TYPE_CIRCLIST);

            /*
             * Restore root.
             */

            WORD_WRAP_SOURCE(mlist) = root;
        }
        UpdateMConcatNode(root);
        return;
    }

    /*
     * Acyclic list.
     */

    if (length == 0 || first >= length) {
        /*
         * No-op.
         */

        return;
    }

    if (last >= length) {
        last = length-1;
    }

    /*
     * General case.
     */

    MListRemove(&WORD_WRAP_SOURCE(mlist), first, last);
}